

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avx512vnni_gemm.h
# Opt level: O3

void __thiscall
intgemm::AVX512VNNI::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWrite>
          (Kernels8 *this,int8_t *A,int8_t *B,Index A_rows,Index width,Index B_cols,
          UnquantizeAndWrite callback)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  undefined1 auVar11 [32];
  char cVar12;
  ulong uVar13;
  ulong uVar14;
  undefined4 in_register_0000008c;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  float in_XMM0_Da;
  undefined1 in_ZMM3 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  
  if (width != 0) {
    uVar16 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xd0c050409080100));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0xf0e07060b0a0302));
    auVar21 = vpternlogd_avx512f(in_ZMM3,in_ZMM3,in_ZMM3,0xff);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    uVar17 = 0;
    do {
      if ((int)B != 0) {
        uVar15 = 0;
        uVar13 = 0;
        do {
          auVar34 = ZEXT1664((undefined1  [16])0x0);
          auVar35 = ZEXT1664((undefined1  [16])0x0);
          auVar36 = ZEXT1664((undefined1  [16])0x0);
          auVar37 = ZEXT1664((undefined1  [16])0x0);
          auVar38 = ZEXT1664((undefined1  [16])0x0);
          auVar39 = ZEXT1664((undefined1  [16])0x0);
          auVar41 = ZEXT1664((undefined1  [16])0x0);
          auVar40 = ZEXT1664((undefined1  [16])0x0);
          if (0x3f < A_rows) {
            uVar14 = 0;
            do {
              auVar22 = vmovdqa64_avx512f(*(undefined1 (*) [64])(this + uVar14 + uVar15));
              auVar23 = vmovdqa64_avx512f(*(undefined1 (*) [64])(A + uVar14 * 8 + uVar16 * 0x40));
              auVar24 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x40));
              auVar25 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x80));
              auVar26 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0xc0));
              auVar27 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x100));
              auVar28 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x140));
              auVar29 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x180));
              auVar30 = vmovdqa64_avx512f(*(undefined1 (*) [64])
                                           (A + uVar14 * 8 + uVar16 * 0x40 + 0x1c0));
              uVar10 = vpcmpgtb_avx512bw(auVar22,auVar21);
              auVar22 = vpabsb_avx512bw(auVar22);
              auVar31 = vpsubb_avx512bw(auVar33,auVar23);
              auVar32 = vmovdqu8_avx512bw(auVar23);
              bVar1 = (byte)uVar10;
              auVar23[0] = (bVar1 & 1) * auVar32[0] | !(bool)(bVar1 & 1) * auVar31[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar23[1] = bVar2 * auVar32[1] | !bVar2 * auVar31[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar23[2] = bVar2 * auVar32[2] | !bVar2 * auVar31[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar23[3] = bVar2 * auVar32[3] | !bVar2 * auVar31[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar23[4] = bVar2 * auVar32[4] | !bVar2 * auVar31[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar23[5] = bVar2 * auVar32[5] | !bVar2 * auVar31[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar23[6] = bVar2 * auVar32[6] | !bVar2 * auVar31[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar23[7] = bVar2 * auVar32[7] | !bVar2 * auVar31[7];
              bVar3 = (byte)(uVar10 >> 8);
              auVar23[8] = (bVar3 & 1) * auVar32[8] | !(bool)(bVar3 & 1) * auVar31[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar23[9] = bVar2 * auVar32[9] | !bVar2 * auVar31[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar23[10] = bVar2 * auVar32[10] | !bVar2 * auVar31[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar23[0xb] = bVar2 * auVar32[0xb] | !bVar2 * auVar31[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar23[0xc] = bVar2 * auVar32[0xc] | !bVar2 * auVar31[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar23[0xd] = bVar2 * auVar32[0xd] | !bVar2 * auVar31[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar23[0xe] = bVar2 * auVar32[0xe] | !bVar2 * auVar31[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar23[0xf] = bVar2 * auVar32[0xf] | !bVar2 * auVar31[0xf];
              bVar4 = (byte)(uVar10 >> 0x10);
              auVar23[0x10] = (bVar4 & 1) * auVar32[0x10] | !(bool)(bVar4 & 1) * auVar31[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar23[0x11] = bVar2 * auVar32[0x11] | !bVar2 * auVar31[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar23[0x12] = bVar2 * auVar32[0x12] | !bVar2 * auVar31[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar23[0x13] = bVar2 * auVar32[0x13] | !bVar2 * auVar31[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar23[0x14] = bVar2 * auVar32[0x14] | !bVar2 * auVar31[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar23[0x15] = bVar2 * auVar32[0x15] | !bVar2 * auVar31[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar23[0x16] = bVar2 * auVar32[0x16] | !bVar2 * auVar31[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar23[0x17] = bVar2 * auVar32[0x17] | !bVar2 * auVar31[0x17];
              bVar5 = (byte)(uVar10 >> 0x18);
              auVar23[0x18] = (bVar5 & 1) * auVar32[0x18] | !(bool)(bVar5 & 1) * auVar31[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar23[0x19] = bVar2 * auVar32[0x19] | !bVar2 * auVar31[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar23[0x1a] = bVar2 * auVar32[0x1a] | !bVar2 * auVar31[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar23[0x1b] = bVar2 * auVar32[0x1b] | !bVar2 * auVar31[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar23[0x1c] = bVar2 * auVar32[0x1c] | !bVar2 * auVar31[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar23[0x1d] = bVar2 * auVar32[0x1d] | !bVar2 * auVar31[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar23[0x1e] = bVar2 * auVar32[0x1e] | !bVar2 * auVar31[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar23[0x1f] = bVar2 * auVar32[0x1f] | !bVar2 * auVar31[0x1f];
              bVar6 = (byte)(uVar10 >> 0x20);
              auVar23[0x20] = (bVar6 & 1) * auVar32[0x20] | !(bool)(bVar6 & 1) * auVar31[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar23[0x21] = bVar2 * auVar32[0x21] | !bVar2 * auVar31[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar23[0x22] = bVar2 * auVar32[0x22] | !bVar2 * auVar31[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar23[0x23] = bVar2 * auVar32[0x23] | !bVar2 * auVar31[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar23[0x24] = bVar2 * auVar32[0x24] | !bVar2 * auVar31[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar23[0x25] = bVar2 * auVar32[0x25] | !bVar2 * auVar31[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar23[0x26] = bVar2 * auVar32[0x26] | !bVar2 * auVar31[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar23[0x27] = bVar2 * auVar32[0x27] | !bVar2 * auVar31[0x27];
              bVar7 = (byte)(uVar10 >> 0x28);
              auVar23[0x28] = (bVar7 & 1) * auVar32[0x28] | !(bool)(bVar7 & 1) * auVar31[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar23[0x29] = bVar2 * auVar32[0x29] | !bVar2 * auVar31[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar23[0x2a] = bVar2 * auVar32[0x2a] | !bVar2 * auVar31[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar23[0x2b] = bVar2 * auVar32[0x2b] | !bVar2 * auVar31[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar23[0x2c] = bVar2 * auVar32[0x2c] | !bVar2 * auVar31[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar23[0x2d] = bVar2 * auVar32[0x2d] | !bVar2 * auVar31[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar23[0x2e] = bVar2 * auVar32[0x2e] | !bVar2 * auVar31[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar23[0x2f] = bVar2 * auVar32[0x2f] | !bVar2 * auVar31[0x2f];
              bVar8 = (byte)(uVar10 >> 0x30);
              auVar23[0x30] = (bVar8 & 1) * auVar32[0x30] | !(bool)(bVar8 & 1) * auVar31[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar23[0x31] = bVar2 * auVar32[0x31] | !bVar2 * auVar31[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar23[0x32] = bVar2 * auVar32[0x32] | !bVar2 * auVar31[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar23[0x33] = bVar2 * auVar32[0x33] | !bVar2 * auVar31[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar23[0x34] = bVar2 * auVar32[0x34] | !bVar2 * auVar31[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar23[0x35] = bVar2 * auVar32[0x35] | !bVar2 * auVar31[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar23[0x36] = bVar2 * auVar32[0x36] | !bVar2 * auVar31[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar23[0x37] = bVar2 * auVar32[0x37] | !bVar2 * auVar31[0x37];
              bVar9 = (byte)(uVar10 >> 0x38);
              auVar23[0x38] = (bVar9 & 1) * auVar32[0x38] | !(bool)(bVar9 & 1) * auVar31[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar23[0x39] = bVar2 * auVar32[0x39] | !bVar2 * auVar31[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar23[0x3a] = bVar2 * auVar32[0x3a] | !bVar2 * auVar31[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar23[0x3b] = bVar2 * auVar32[0x3b] | !bVar2 * auVar31[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar23[0x3c] = bVar2 * auVar32[0x3c] | !bVar2 * auVar31[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar23[0x3d] = bVar2 * auVar32[0x3d] | !bVar2 * auVar31[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar23[0x3e] = bVar2 * auVar32[0x3e] | !bVar2 * auVar31[0x3e];
              cVar12 = (char)bVar9 >> 7;
              auVar23[0x3f] = -cVar12 * auVar32[0x3f] | !(bool)-cVar12 * auVar31[0x3f];
              auVar31 = vpsubb_avx512bw(auVar33,auVar24);
              auVar24 = vmovdqu8_avx512bw(auVar24);
              auVar32[0] = (bVar1 & 1) * auVar24[0] | !(bool)(bVar1 & 1) * auVar31[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar32[1] = bVar2 * auVar24[1] | !bVar2 * auVar31[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar32[2] = bVar2 * auVar24[2] | !bVar2 * auVar31[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar32[3] = bVar2 * auVar24[3] | !bVar2 * auVar31[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar32[4] = bVar2 * auVar24[4] | !bVar2 * auVar31[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar32[5] = bVar2 * auVar24[5] | !bVar2 * auVar31[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar32[6] = bVar2 * auVar24[6] | !bVar2 * auVar31[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar32[7] = bVar2 * auVar24[7] | !bVar2 * auVar31[7];
              auVar32[8] = (bVar3 & 1) * auVar24[8] | !(bool)(bVar3 & 1) * auVar31[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar32[9] = bVar2 * auVar24[9] | !bVar2 * auVar31[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar32[10] = bVar2 * auVar24[10] | !bVar2 * auVar31[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar32[0xb] = bVar2 * auVar24[0xb] | !bVar2 * auVar31[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar32[0xc] = bVar2 * auVar24[0xc] | !bVar2 * auVar31[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar32[0xd] = bVar2 * auVar24[0xd] | !bVar2 * auVar31[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar32[0xe] = bVar2 * auVar24[0xe] | !bVar2 * auVar31[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar32[0xf] = bVar2 * auVar24[0xf] | !bVar2 * auVar31[0xf];
              auVar32[0x10] = (bVar4 & 1) * auVar24[0x10] | !(bool)(bVar4 & 1) * auVar31[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar32[0x11] = bVar2 * auVar24[0x11] | !bVar2 * auVar31[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar32[0x12] = bVar2 * auVar24[0x12] | !bVar2 * auVar31[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar32[0x13] = bVar2 * auVar24[0x13] | !bVar2 * auVar31[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar32[0x14] = bVar2 * auVar24[0x14] | !bVar2 * auVar31[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar32[0x15] = bVar2 * auVar24[0x15] | !bVar2 * auVar31[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar32[0x16] = bVar2 * auVar24[0x16] | !bVar2 * auVar31[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar32[0x17] = bVar2 * auVar24[0x17] | !bVar2 * auVar31[0x17];
              auVar32[0x18] = (bVar5 & 1) * auVar24[0x18] | !(bool)(bVar5 & 1) * auVar31[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar32[0x19] = bVar2 * auVar24[0x19] | !bVar2 * auVar31[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar32[0x1a] = bVar2 * auVar24[0x1a] | !bVar2 * auVar31[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar32[0x1b] = bVar2 * auVar24[0x1b] | !bVar2 * auVar31[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar32[0x1c] = bVar2 * auVar24[0x1c] | !bVar2 * auVar31[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar32[0x1d] = bVar2 * auVar24[0x1d] | !bVar2 * auVar31[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar32[0x1e] = bVar2 * auVar24[0x1e] | !bVar2 * auVar31[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar32[0x1f] = bVar2 * auVar24[0x1f] | !bVar2 * auVar31[0x1f];
              auVar32[0x20] = (bVar6 & 1) * auVar24[0x20] | !(bool)(bVar6 & 1) * auVar31[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar32[0x21] = bVar2 * auVar24[0x21] | !bVar2 * auVar31[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar32[0x22] = bVar2 * auVar24[0x22] | !bVar2 * auVar31[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar32[0x23] = bVar2 * auVar24[0x23] | !bVar2 * auVar31[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar32[0x24] = bVar2 * auVar24[0x24] | !bVar2 * auVar31[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar32[0x25] = bVar2 * auVar24[0x25] | !bVar2 * auVar31[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar32[0x26] = bVar2 * auVar24[0x26] | !bVar2 * auVar31[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar32[0x27] = bVar2 * auVar24[0x27] | !bVar2 * auVar31[0x27];
              auVar32[0x28] = (bVar7 & 1) * auVar24[0x28] | !(bool)(bVar7 & 1) * auVar31[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar32[0x29] = bVar2 * auVar24[0x29] | !bVar2 * auVar31[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar32[0x2a] = bVar2 * auVar24[0x2a] | !bVar2 * auVar31[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar32[0x2b] = bVar2 * auVar24[0x2b] | !bVar2 * auVar31[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar32[0x2c] = bVar2 * auVar24[0x2c] | !bVar2 * auVar31[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar32[0x2d] = bVar2 * auVar24[0x2d] | !bVar2 * auVar31[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar32[0x2e] = bVar2 * auVar24[0x2e] | !bVar2 * auVar31[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar32[0x2f] = bVar2 * auVar24[0x2f] | !bVar2 * auVar31[0x2f];
              auVar32[0x30] = (bVar8 & 1) * auVar24[0x30] | !(bool)(bVar8 & 1) * auVar31[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar32[0x31] = bVar2 * auVar24[0x31] | !bVar2 * auVar31[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar32[0x32] = bVar2 * auVar24[0x32] | !bVar2 * auVar31[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar32[0x33] = bVar2 * auVar24[0x33] | !bVar2 * auVar31[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar32[0x34] = bVar2 * auVar24[0x34] | !bVar2 * auVar31[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar32[0x35] = bVar2 * auVar24[0x35] | !bVar2 * auVar31[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar32[0x36] = bVar2 * auVar24[0x36] | !bVar2 * auVar31[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar32[0x37] = bVar2 * auVar24[0x37] | !bVar2 * auVar31[0x37];
              auVar32[0x38] = (bVar9 & 1) * auVar24[0x38] | !(bool)(bVar9 & 1) * auVar31[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar32[0x39] = bVar2 * auVar24[0x39] | !bVar2 * auVar31[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar32[0x3a] = bVar2 * auVar24[0x3a] | !bVar2 * auVar31[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar32[0x3b] = bVar2 * auVar24[0x3b] | !bVar2 * auVar31[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar32[0x3c] = bVar2 * auVar24[0x3c] | !bVar2 * auVar31[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar32[0x3d] = bVar2 * auVar24[0x3d] | !bVar2 * auVar31[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar32[0x3e] = bVar2 * auVar24[0x3e] | !bVar2 * auVar31[0x3e];
              auVar32[0x3f] = -cVar12 * auVar24[0x3f] | !(bool)-cVar12 * auVar31[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar25);
              auVar31 = vmovdqu8_avx512bw(auVar25);
              auVar25[0] = (bVar1 & 1) * auVar31[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar25[1] = bVar2 * auVar31[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar25[2] = bVar2 * auVar31[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar25[3] = bVar2 * auVar31[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar25[4] = bVar2 * auVar31[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar25[5] = bVar2 * auVar31[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar25[6] = bVar2 * auVar31[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar25[7] = bVar2 * auVar31[7] | !bVar2 * auVar24[7];
              auVar25[8] = (bVar3 & 1) * auVar31[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar25[9] = bVar2 * auVar31[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar25[10] = bVar2 * auVar31[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar25[0xb] = bVar2 * auVar31[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar25[0xc] = bVar2 * auVar31[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar25[0xd] = bVar2 * auVar31[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar25[0xe] = bVar2 * auVar31[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar25[0xf] = bVar2 * auVar31[0xf] | !bVar2 * auVar24[0xf];
              auVar25[0x10] = (bVar4 & 1) * auVar31[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar25[0x11] = bVar2 * auVar31[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar25[0x12] = bVar2 * auVar31[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar25[0x13] = bVar2 * auVar31[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar25[0x14] = bVar2 * auVar31[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar25[0x15] = bVar2 * auVar31[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar25[0x16] = bVar2 * auVar31[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar25[0x17] = bVar2 * auVar31[0x17] | !bVar2 * auVar24[0x17];
              auVar25[0x18] = (bVar5 & 1) * auVar31[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar25[0x19] = bVar2 * auVar31[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar25[0x1a] = bVar2 * auVar31[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar25[0x1b] = bVar2 * auVar31[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar25[0x1c] = bVar2 * auVar31[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar25[0x1d] = bVar2 * auVar31[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar25[0x1e] = bVar2 * auVar31[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar25[0x1f] = bVar2 * auVar31[0x1f] | !bVar2 * auVar24[0x1f];
              auVar25[0x20] = (bVar6 & 1) * auVar31[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar25[0x21] = bVar2 * auVar31[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar25[0x22] = bVar2 * auVar31[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar25[0x23] = bVar2 * auVar31[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar25[0x24] = bVar2 * auVar31[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar25[0x25] = bVar2 * auVar31[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar25[0x26] = bVar2 * auVar31[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar25[0x27] = bVar2 * auVar31[0x27] | !bVar2 * auVar24[0x27];
              auVar25[0x28] = (bVar7 & 1) * auVar31[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar25[0x29] = bVar2 * auVar31[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar25[0x2a] = bVar2 * auVar31[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar25[0x2b] = bVar2 * auVar31[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar25[0x2c] = bVar2 * auVar31[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar25[0x2d] = bVar2 * auVar31[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar25[0x2e] = bVar2 * auVar31[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar25[0x2f] = bVar2 * auVar31[0x2f] | !bVar2 * auVar24[0x2f];
              auVar25[0x30] = (bVar8 & 1) * auVar31[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar25[0x31] = bVar2 * auVar31[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar25[0x32] = bVar2 * auVar31[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar25[0x33] = bVar2 * auVar31[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar25[0x34] = bVar2 * auVar31[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar25[0x35] = bVar2 * auVar31[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar25[0x36] = bVar2 * auVar31[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar25[0x37] = bVar2 * auVar31[0x37] | !bVar2 * auVar24[0x37];
              auVar25[0x38] = (bVar9 & 1) * auVar31[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar25[0x39] = bVar2 * auVar31[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar25[0x3a] = bVar2 * auVar31[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar25[0x3b] = bVar2 * auVar31[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar25[0x3c] = bVar2 * auVar31[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar25[0x3d] = bVar2 * auVar31[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar25[0x3e] = bVar2 * auVar31[0x3e] | !bVar2 * auVar24[0x3e];
              auVar25[0x3f] = -cVar12 * auVar31[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar26);
              auVar26 = vmovdqu8_avx512bw(auVar26);
              auVar31[0] = (bVar1 & 1) * auVar26[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar31[1] = bVar2 * auVar26[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar31[2] = bVar2 * auVar26[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar31[3] = bVar2 * auVar26[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar31[4] = bVar2 * auVar26[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar31[5] = bVar2 * auVar26[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar31[6] = bVar2 * auVar26[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar31[7] = bVar2 * auVar26[7] | !bVar2 * auVar24[7];
              auVar31[8] = (bVar3 & 1) * auVar26[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar31[9] = bVar2 * auVar26[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar31[10] = bVar2 * auVar26[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar31[0xb] = bVar2 * auVar26[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar31[0xc] = bVar2 * auVar26[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar31[0xd] = bVar2 * auVar26[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar31[0xe] = bVar2 * auVar26[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar31[0xf] = bVar2 * auVar26[0xf] | !bVar2 * auVar24[0xf];
              auVar31[0x10] = (bVar4 & 1) * auVar26[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar31[0x11] = bVar2 * auVar26[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar31[0x12] = bVar2 * auVar26[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar31[0x13] = bVar2 * auVar26[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar31[0x14] = bVar2 * auVar26[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar31[0x15] = bVar2 * auVar26[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar31[0x16] = bVar2 * auVar26[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar31[0x17] = bVar2 * auVar26[0x17] | !bVar2 * auVar24[0x17];
              auVar31[0x18] = (bVar5 & 1) * auVar26[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar31[0x19] = bVar2 * auVar26[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar31[0x1a] = bVar2 * auVar26[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar31[0x1b] = bVar2 * auVar26[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar31[0x1c] = bVar2 * auVar26[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar31[0x1d] = bVar2 * auVar26[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar31[0x1e] = bVar2 * auVar26[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar31[0x1f] = bVar2 * auVar26[0x1f] | !bVar2 * auVar24[0x1f];
              auVar31[0x20] = (bVar6 & 1) * auVar26[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar31[0x21] = bVar2 * auVar26[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar31[0x22] = bVar2 * auVar26[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar31[0x23] = bVar2 * auVar26[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar31[0x24] = bVar2 * auVar26[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar31[0x25] = bVar2 * auVar26[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar31[0x26] = bVar2 * auVar26[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar31[0x27] = bVar2 * auVar26[0x27] | !bVar2 * auVar24[0x27];
              auVar31[0x28] = (bVar7 & 1) * auVar26[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar31[0x29] = bVar2 * auVar26[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar31[0x2a] = bVar2 * auVar26[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar31[0x2b] = bVar2 * auVar26[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar31[0x2c] = bVar2 * auVar26[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar31[0x2d] = bVar2 * auVar26[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar31[0x2e] = bVar2 * auVar26[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar31[0x2f] = bVar2 * auVar26[0x2f] | !bVar2 * auVar24[0x2f];
              auVar31[0x30] = (bVar8 & 1) * auVar26[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar31[0x31] = bVar2 * auVar26[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar31[0x32] = bVar2 * auVar26[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar31[0x33] = bVar2 * auVar26[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar31[0x34] = bVar2 * auVar26[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar31[0x35] = bVar2 * auVar26[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar31[0x36] = bVar2 * auVar26[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar31[0x37] = bVar2 * auVar26[0x37] | !bVar2 * auVar24[0x37];
              auVar31[0x38] = (bVar9 & 1) * auVar26[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar31[0x39] = bVar2 * auVar26[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar31[0x3a] = bVar2 * auVar26[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar31[0x3b] = bVar2 * auVar26[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar31[0x3c] = bVar2 * auVar26[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar31[0x3d] = bVar2 * auVar26[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar31[0x3e] = bVar2 * auVar26[0x3e] | !bVar2 * auVar24[0x3e];
              auVar31[0x3f] = -cVar12 * auVar26[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar27);
              auVar27 = vmovdqu8_avx512bw(auVar27);
              auVar26[0] = (bVar1 & 1) * auVar27[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar26[1] = bVar2 * auVar27[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar26[2] = bVar2 * auVar27[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar26[3] = bVar2 * auVar27[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar26[4] = bVar2 * auVar27[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar26[5] = bVar2 * auVar27[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar26[6] = bVar2 * auVar27[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar26[7] = bVar2 * auVar27[7] | !bVar2 * auVar24[7];
              auVar26[8] = (bVar3 & 1) * auVar27[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar26[9] = bVar2 * auVar27[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar26[10] = bVar2 * auVar27[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar26[0xb] = bVar2 * auVar27[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar26[0xc] = bVar2 * auVar27[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar26[0xd] = bVar2 * auVar27[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar26[0xe] = bVar2 * auVar27[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar26[0xf] = bVar2 * auVar27[0xf] | !bVar2 * auVar24[0xf];
              auVar26[0x10] = (bVar4 & 1) * auVar27[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar26[0x11] = bVar2 * auVar27[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar26[0x12] = bVar2 * auVar27[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar26[0x13] = bVar2 * auVar27[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar26[0x14] = bVar2 * auVar27[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar26[0x15] = bVar2 * auVar27[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar26[0x16] = bVar2 * auVar27[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar26[0x17] = bVar2 * auVar27[0x17] | !bVar2 * auVar24[0x17];
              auVar26[0x18] = (bVar5 & 1) * auVar27[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar26[0x19] = bVar2 * auVar27[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar26[0x1a] = bVar2 * auVar27[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar26[0x1b] = bVar2 * auVar27[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar26[0x1c] = bVar2 * auVar27[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar26[0x1d] = bVar2 * auVar27[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar26[0x1e] = bVar2 * auVar27[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar26[0x1f] = bVar2 * auVar27[0x1f] | !bVar2 * auVar24[0x1f];
              auVar26[0x20] = (bVar6 & 1) * auVar27[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar26[0x21] = bVar2 * auVar27[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar26[0x22] = bVar2 * auVar27[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar26[0x23] = bVar2 * auVar27[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar26[0x24] = bVar2 * auVar27[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar26[0x25] = bVar2 * auVar27[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar26[0x26] = bVar2 * auVar27[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar26[0x27] = bVar2 * auVar27[0x27] | !bVar2 * auVar24[0x27];
              auVar26[0x28] = (bVar7 & 1) * auVar27[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar26[0x29] = bVar2 * auVar27[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar26[0x2a] = bVar2 * auVar27[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar26[0x2b] = bVar2 * auVar27[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar26[0x2c] = bVar2 * auVar27[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar26[0x2d] = bVar2 * auVar27[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar26[0x2e] = bVar2 * auVar27[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar26[0x2f] = bVar2 * auVar27[0x2f] | !bVar2 * auVar24[0x2f];
              auVar26[0x30] = (bVar8 & 1) * auVar27[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar26[0x31] = bVar2 * auVar27[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar26[0x32] = bVar2 * auVar27[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar26[0x33] = bVar2 * auVar27[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar26[0x34] = bVar2 * auVar27[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar26[0x35] = bVar2 * auVar27[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar26[0x36] = bVar2 * auVar27[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar26[0x37] = bVar2 * auVar27[0x37] | !bVar2 * auVar24[0x37];
              auVar26[0x38] = (bVar9 & 1) * auVar27[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar26[0x39] = bVar2 * auVar27[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar26[0x3a] = bVar2 * auVar27[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar26[0x3b] = bVar2 * auVar27[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar26[0x3c] = bVar2 * auVar27[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar26[0x3d] = bVar2 * auVar27[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar26[0x3e] = bVar2 * auVar27[0x3e] | !bVar2 * auVar24[0x3e];
              auVar26[0x3f] = -cVar12 * auVar27[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar28);
              auVar28 = vmovdqu8_avx512bw(auVar28);
              auVar27[0] = (bVar1 & 1) * auVar28[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar27[1] = bVar2 * auVar28[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar27[2] = bVar2 * auVar28[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar27[3] = bVar2 * auVar28[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar27[4] = bVar2 * auVar28[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar27[5] = bVar2 * auVar28[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar27[6] = bVar2 * auVar28[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar27[7] = bVar2 * auVar28[7] | !bVar2 * auVar24[7];
              auVar27[8] = (bVar3 & 1) * auVar28[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar27[9] = bVar2 * auVar28[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar27[10] = bVar2 * auVar28[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar27[0xb] = bVar2 * auVar28[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar27[0xc] = bVar2 * auVar28[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar27[0xd] = bVar2 * auVar28[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar27[0xe] = bVar2 * auVar28[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar27[0xf] = bVar2 * auVar28[0xf] | !bVar2 * auVar24[0xf];
              auVar27[0x10] = (bVar4 & 1) * auVar28[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar27[0x11] = bVar2 * auVar28[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar27[0x12] = bVar2 * auVar28[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar27[0x13] = bVar2 * auVar28[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar27[0x14] = bVar2 * auVar28[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar27[0x15] = bVar2 * auVar28[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar27[0x16] = bVar2 * auVar28[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar27[0x17] = bVar2 * auVar28[0x17] | !bVar2 * auVar24[0x17];
              auVar27[0x18] = (bVar5 & 1) * auVar28[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar27[0x19] = bVar2 * auVar28[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar27[0x1a] = bVar2 * auVar28[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar27[0x1b] = bVar2 * auVar28[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar27[0x1c] = bVar2 * auVar28[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar27[0x1d] = bVar2 * auVar28[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar27[0x1e] = bVar2 * auVar28[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar27[0x1f] = bVar2 * auVar28[0x1f] | !bVar2 * auVar24[0x1f];
              auVar27[0x20] = (bVar6 & 1) * auVar28[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar27[0x21] = bVar2 * auVar28[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar27[0x22] = bVar2 * auVar28[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar27[0x23] = bVar2 * auVar28[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar27[0x24] = bVar2 * auVar28[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar27[0x25] = bVar2 * auVar28[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar27[0x26] = bVar2 * auVar28[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar27[0x27] = bVar2 * auVar28[0x27] | !bVar2 * auVar24[0x27];
              auVar27[0x28] = (bVar7 & 1) * auVar28[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar27[0x29] = bVar2 * auVar28[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar27[0x2a] = bVar2 * auVar28[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar27[0x2b] = bVar2 * auVar28[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar27[0x2c] = bVar2 * auVar28[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar27[0x2d] = bVar2 * auVar28[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar27[0x2e] = bVar2 * auVar28[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar27[0x2f] = bVar2 * auVar28[0x2f] | !bVar2 * auVar24[0x2f];
              auVar27[0x30] = (bVar8 & 1) * auVar28[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar27[0x31] = bVar2 * auVar28[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar27[0x32] = bVar2 * auVar28[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar27[0x33] = bVar2 * auVar28[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar27[0x34] = bVar2 * auVar28[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar27[0x35] = bVar2 * auVar28[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar27[0x36] = bVar2 * auVar28[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar27[0x37] = bVar2 * auVar28[0x37] | !bVar2 * auVar24[0x37];
              auVar27[0x38] = (bVar9 & 1) * auVar28[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar27[0x39] = bVar2 * auVar28[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar27[0x3a] = bVar2 * auVar28[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar27[0x3b] = bVar2 * auVar28[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar27[0x3c] = bVar2 * auVar28[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar27[0x3d] = bVar2 * auVar28[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar27[0x3e] = bVar2 * auVar28[0x3e] | !bVar2 * auVar24[0x3e];
              auVar27[0x3f] = -cVar12 * auVar28[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar29);
              auVar29 = vmovdqu8_avx512bw(auVar29);
              auVar28[0] = (bVar1 & 1) * auVar29[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar28[1] = bVar2 * auVar29[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar28[2] = bVar2 * auVar29[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar28[3] = bVar2 * auVar29[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar28[4] = bVar2 * auVar29[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar28[5] = bVar2 * auVar29[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar28[6] = bVar2 * auVar29[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar28[7] = bVar2 * auVar29[7] | !bVar2 * auVar24[7];
              auVar28[8] = (bVar3 & 1) * auVar29[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar28[9] = bVar2 * auVar29[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar28[10] = bVar2 * auVar29[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar28[0xb] = bVar2 * auVar29[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar28[0xc] = bVar2 * auVar29[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar28[0xd] = bVar2 * auVar29[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar28[0xe] = bVar2 * auVar29[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar28[0xf] = bVar2 * auVar29[0xf] | !bVar2 * auVar24[0xf];
              auVar28[0x10] = (bVar4 & 1) * auVar29[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar28[0x11] = bVar2 * auVar29[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar28[0x12] = bVar2 * auVar29[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar28[0x13] = bVar2 * auVar29[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar28[0x14] = bVar2 * auVar29[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar28[0x15] = bVar2 * auVar29[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar28[0x16] = bVar2 * auVar29[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar28[0x17] = bVar2 * auVar29[0x17] | !bVar2 * auVar24[0x17];
              auVar28[0x18] = (bVar5 & 1) * auVar29[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar28[0x19] = bVar2 * auVar29[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar28[0x1a] = bVar2 * auVar29[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar28[0x1b] = bVar2 * auVar29[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar28[0x1c] = bVar2 * auVar29[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar28[0x1d] = bVar2 * auVar29[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar28[0x1e] = bVar2 * auVar29[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar28[0x1f] = bVar2 * auVar29[0x1f] | !bVar2 * auVar24[0x1f];
              auVar28[0x20] = (bVar6 & 1) * auVar29[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar28[0x21] = bVar2 * auVar29[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar28[0x22] = bVar2 * auVar29[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar28[0x23] = bVar2 * auVar29[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar28[0x24] = bVar2 * auVar29[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar28[0x25] = bVar2 * auVar29[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar28[0x26] = bVar2 * auVar29[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar28[0x27] = bVar2 * auVar29[0x27] | !bVar2 * auVar24[0x27];
              auVar28[0x28] = (bVar7 & 1) * auVar29[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar28[0x29] = bVar2 * auVar29[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar28[0x2a] = bVar2 * auVar29[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar28[0x2b] = bVar2 * auVar29[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar28[0x2c] = bVar2 * auVar29[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar28[0x2d] = bVar2 * auVar29[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar28[0x2e] = bVar2 * auVar29[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar28[0x2f] = bVar2 * auVar29[0x2f] | !bVar2 * auVar24[0x2f];
              auVar28[0x30] = (bVar8 & 1) * auVar29[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar28[0x31] = bVar2 * auVar29[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar28[0x32] = bVar2 * auVar29[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar28[0x33] = bVar2 * auVar29[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar28[0x34] = bVar2 * auVar29[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar28[0x35] = bVar2 * auVar29[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar28[0x36] = bVar2 * auVar29[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar28[0x37] = bVar2 * auVar29[0x37] | !bVar2 * auVar24[0x37];
              auVar28[0x38] = (bVar9 & 1) * auVar29[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar28[0x39] = bVar2 * auVar29[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar28[0x3a] = bVar2 * auVar29[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar28[0x3b] = bVar2 * auVar29[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar28[0x3c] = bVar2 * auVar29[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar28[0x3d] = bVar2 * auVar29[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar28[0x3e] = bVar2 * auVar29[0x3e] | !bVar2 * auVar24[0x3e];
              auVar28[0x3f] = -cVar12 * auVar29[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar24 = vpsubb_avx512bw(auVar33,auVar30);
              auVar29 = vmovdqu8_avx512bw(auVar30);
              auVar30[0] = (bVar1 & 1) * auVar29[0] | !(bool)(bVar1 & 1) * auVar24[0];
              bVar2 = (bool)((byte)(uVar10 >> 1) & 1);
              auVar30[1] = bVar2 * auVar29[1] | !bVar2 * auVar24[1];
              bVar2 = (bool)((byte)(uVar10 >> 2) & 1);
              auVar30[2] = bVar2 * auVar29[2] | !bVar2 * auVar24[2];
              bVar2 = (bool)((byte)(uVar10 >> 3) & 1);
              auVar30[3] = bVar2 * auVar29[3] | !bVar2 * auVar24[3];
              bVar2 = (bool)((byte)(uVar10 >> 4) & 1);
              auVar30[4] = bVar2 * auVar29[4] | !bVar2 * auVar24[4];
              bVar2 = (bool)((byte)(uVar10 >> 5) & 1);
              auVar30[5] = bVar2 * auVar29[5] | !bVar2 * auVar24[5];
              bVar2 = (bool)((byte)(uVar10 >> 6) & 1);
              auVar30[6] = bVar2 * auVar29[6] | !bVar2 * auVar24[6];
              bVar2 = (bool)((byte)(uVar10 >> 7) & 1);
              auVar30[7] = bVar2 * auVar29[7] | !bVar2 * auVar24[7];
              auVar30[8] = (bVar3 & 1) * auVar29[8] | !(bool)(bVar3 & 1) * auVar24[8];
              bVar2 = (bool)((byte)(uVar10 >> 9) & 1);
              auVar30[9] = bVar2 * auVar29[9] | !bVar2 * auVar24[9];
              bVar2 = (bool)((byte)(uVar10 >> 10) & 1);
              auVar30[10] = bVar2 * auVar29[10] | !bVar2 * auVar24[10];
              bVar2 = (bool)((byte)(uVar10 >> 0xb) & 1);
              auVar30[0xb] = bVar2 * auVar29[0xb] | !bVar2 * auVar24[0xb];
              bVar2 = (bool)((byte)(uVar10 >> 0xc) & 1);
              auVar30[0xc] = bVar2 * auVar29[0xc] | !bVar2 * auVar24[0xc];
              bVar2 = (bool)((byte)(uVar10 >> 0xd) & 1);
              auVar30[0xd] = bVar2 * auVar29[0xd] | !bVar2 * auVar24[0xd];
              bVar2 = (bool)((byte)(uVar10 >> 0xe) & 1);
              auVar30[0xe] = bVar2 * auVar29[0xe] | !bVar2 * auVar24[0xe];
              bVar2 = (bool)((byte)(uVar10 >> 0xf) & 1);
              auVar30[0xf] = bVar2 * auVar29[0xf] | !bVar2 * auVar24[0xf];
              auVar30[0x10] = (bVar4 & 1) * auVar29[0x10] | !(bool)(bVar4 & 1) * auVar24[0x10];
              bVar2 = (bool)((byte)(uVar10 >> 0x11) & 1);
              auVar30[0x11] = bVar2 * auVar29[0x11] | !bVar2 * auVar24[0x11];
              bVar2 = (bool)((byte)(uVar10 >> 0x12) & 1);
              auVar30[0x12] = bVar2 * auVar29[0x12] | !bVar2 * auVar24[0x12];
              bVar2 = (bool)((byte)(uVar10 >> 0x13) & 1);
              auVar30[0x13] = bVar2 * auVar29[0x13] | !bVar2 * auVar24[0x13];
              bVar2 = (bool)((byte)(uVar10 >> 0x14) & 1);
              auVar30[0x14] = bVar2 * auVar29[0x14] | !bVar2 * auVar24[0x14];
              bVar2 = (bool)((byte)(uVar10 >> 0x15) & 1);
              auVar30[0x15] = bVar2 * auVar29[0x15] | !bVar2 * auVar24[0x15];
              bVar2 = (bool)((byte)(uVar10 >> 0x16) & 1);
              auVar30[0x16] = bVar2 * auVar29[0x16] | !bVar2 * auVar24[0x16];
              bVar2 = (bool)((byte)(uVar10 >> 0x17) & 1);
              auVar30[0x17] = bVar2 * auVar29[0x17] | !bVar2 * auVar24[0x17];
              auVar30[0x18] = (bVar5 & 1) * auVar29[0x18] | !(bool)(bVar5 & 1) * auVar24[0x18];
              bVar2 = (bool)((byte)(uVar10 >> 0x19) & 1);
              auVar30[0x19] = bVar2 * auVar29[0x19] | !bVar2 * auVar24[0x19];
              bVar2 = (bool)((byte)(uVar10 >> 0x1a) & 1);
              auVar30[0x1a] = bVar2 * auVar29[0x1a] | !bVar2 * auVar24[0x1a];
              bVar2 = (bool)((byte)(uVar10 >> 0x1b) & 1);
              auVar30[0x1b] = bVar2 * auVar29[0x1b] | !bVar2 * auVar24[0x1b];
              bVar2 = (bool)((byte)(uVar10 >> 0x1c) & 1);
              auVar30[0x1c] = bVar2 * auVar29[0x1c] | !bVar2 * auVar24[0x1c];
              bVar2 = (bool)((byte)(uVar10 >> 0x1d) & 1);
              auVar30[0x1d] = bVar2 * auVar29[0x1d] | !bVar2 * auVar24[0x1d];
              bVar2 = (bool)((byte)(uVar10 >> 0x1e) & 1);
              auVar30[0x1e] = bVar2 * auVar29[0x1e] | !bVar2 * auVar24[0x1e];
              bVar2 = (bool)((byte)(uVar10 >> 0x1f) & 1);
              auVar30[0x1f] = bVar2 * auVar29[0x1f] | !bVar2 * auVar24[0x1f];
              auVar30[0x20] = (bVar6 & 1) * auVar29[0x20] | !(bool)(bVar6 & 1) * auVar24[0x20];
              bVar2 = (bool)((byte)(uVar10 >> 0x21) & 1);
              auVar30[0x21] = bVar2 * auVar29[0x21] | !bVar2 * auVar24[0x21];
              bVar2 = (bool)((byte)(uVar10 >> 0x22) & 1);
              auVar30[0x22] = bVar2 * auVar29[0x22] | !bVar2 * auVar24[0x22];
              bVar2 = (bool)((byte)(uVar10 >> 0x23) & 1);
              auVar30[0x23] = bVar2 * auVar29[0x23] | !bVar2 * auVar24[0x23];
              bVar2 = (bool)((byte)(uVar10 >> 0x24) & 1);
              auVar30[0x24] = bVar2 * auVar29[0x24] | !bVar2 * auVar24[0x24];
              bVar2 = (bool)((byte)(uVar10 >> 0x25) & 1);
              auVar30[0x25] = bVar2 * auVar29[0x25] | !bVar2 * auVar24[0x25];
              bVar2 = (bool)((byte)(uVar10 >> 0x26) & 1);
              auVar30[0x26] = bVar2 * auVar29[0x26] | !bVar2 * auVar24[0x26];
              bVar2 = (bool)((byte)(uVar10 >> 0x27) & 1);
              auVar30[0x27] = bVar2 * auVar29[0x27] | !bVar2 * auVar24[0x27];
              auVar30[0x28] = (bVar7 & 1) * auVar29[0x28] | !(bool)(bVar7 & 1) * auVar24[0x28];
              bVar2 = (bool)((byte)(uVar10 >> 0x29) & 1);
              auVar30[0x29] = bVar2 * auVar29[0x29] | !bVar2 * auVar24[0x29];
              bVar2 = (bool)((byte)(uVar10 >> 0x2a) & 1);
              auVar30[0x2a] = bVar2 * auVar29[0x2a] | !bVar2 * auVar24[0x2a];
              bVar2 = (bool)((byte)(uVar10 >> 0x2b) & 1);
              auVar30[0x2b] = bVar2 * auVar29[0x2b] | !bVar2 * auVar24[0x2b];
              bVar2 = (bool)((byte)(uVar10 >> 0x2c) & 1);
              auVar30[0x2c] = bVar2 * auVar29[0x2c] | !bVar2 * auVar24[0x2c];
              bVar2 = (bool)((byte)(uVar10 >> 0x2d) & 1);
              auVar30[0x2d] = bVar2 * auVar29[0x2d] | !bVar2 * auVar24[0x2d];
              bVar2 = (bool)((byte)(uVar10 >> 0x2e) & 1);
              auVar30[0x2e] = bVar2 * auVar29[0x2e] | !bVar2 * auVar24[0x2e];
              bVar2 = (bool)((byte)(uVar10 >> 0x2f) & 1);
              auVar30[0x2f] = bVar2 * auVar29[0x2f] | !bVar2 * auVar24[0x2f];
              auVar30[0x30] = (bVar8 & 1) * auVar29[0x30] | !(bool)(bVar8 & 1) * auVar24[0x30];
              bVar2 = (bool)((byte)(uVar10 >> 0x31) & 1);
              auVar30[0x31] = bVar2 * auVar29[0x31] | !bVar2 * auVar24[0x31];
              bVar2 = (bool)((byte)(uVar10 >> 0x32) & 1);
              auVar30[0x32] = bVar2 * auVar29[0x32] | !bVar2 * auVar24[0x32];
              bVar2 = (bool)((byte)(uVar10 >> 0x33) & 1);
              auVar30[0x33] = bVar2 * auVar29[0x33] | !bVar2 * auVar24[0x33];
              bVar2 = (bool)((byte)(uVar10 >> 0x34) & 1);
              auVar30[0x34] = bVar2 * auVar29[0x34] | !bVar2 * auVar24[0x34];
              bVar2 = (bool)((byte)(uVar10 >> 0x35) & 1);
              auVar30[0x35] = bVar2 * auVar29[0x35] | !bVar2 * auVar24[0x35];
              bVar2 = (bool)((byte)(uVar10 >> 0x36) & 1);
              auVar30[0x36] = bVar2 * auVar29[0x36] | !bVar2 * auVar24[0x36];
              bVar2 = (bool)((byte)(uVar10 >> 0x37) & 1);
              auVar30[0x37] = bVar2 * auVar29[0x37] | !bVar2 * auVar24[0x37];
              auVar30[0x38] = (bVar9 & 1) * auVar29[0x38] | !(bool)(bVar9 & 1) * auVar24[0x38];
              bVar2 = (bool)(bVar9 >> 1 & 1);
              auVar30[0x39] = bVar2 * auVar29[0x39] | !bVar2 * auVar24[0x39];
              bVar2 = (bool)(bVar9 >> 2 & 1);
              auVar30[0x3a] = bVar2 * auVar29[0x3a] | !bVar2 * auVar24[0x3a];
              bVar2 = (bool)(bVar9 >> 3 & 1);
              auVar30[0x3b] = bVar2 * auVar29[0x3b] | !bVar2 * auVar24[0x3b];
              bVar2 = (bool)(bVar9 >> 4 & 1);
              auVar30[0x3c] = bVar2 * auVar29[0x3c] | !bVar2 * auVar24[0x3c];
              bVar2 = (bool)(bVar9 >> 5 & 1);
              auVar30[0x3d] = bVar2 * auVar29[0x3d] | !bVar2 * auVar24[0x3d];
              bVar2 = (bool)(bVar9 >> 6 & 1);
              auVar30[0x3e] = bVar2 * auVar29[0x3e] | !bVar2 * auVar24[0x3e];
              auVar30[0x3f] = -cVar12 * auVar29[0x3f] | !(bool)-cVar12 * auVar24[0x3f];
              auVar40 = vpdpbusds_avx512_vnni(auVar40,auVar22,auVar23);
              auVar41 = vpdpbusds_avx512_vnni(auVar41,auVar22,auVar32);
              auVar39 = vpdpbusds_avx512_vnni(auVar39,auVar22,auVar25);
              auVar38 = vpdpbusds_avx512_vnni(auVar38,auVar22,auVar31);
              auVar37 = vpdpbusds_avx512_vnni(auVar37,auVar22,auVar26);
              auVar36 = vpdpbusds_avx512_vnni(auVar36,auVar22,auVar27);
              auVar35 = vpdpbusds_avx512_vnni(auVar35,auVar22,auVar28);
              auVar34 = vpdpbusds_avx512_vnni(auVar34,auVar22,auVar30);
              uVar14 = uVar14 + 0x40;
            } while ((A_rows >> 6) << 6 != uVar14);
          }
          auVar22 = vpunpckldq_avx512f(auVar40,auVar41);
          auVar40 = vpunpckhdq_avx512f(auVar40,auVar41);
          auVar40 = vpaddd_avx512f(auVar40,auVar22);
          auVar41 = vpunpckldq_avx512f(auVar39,auVar38);
          auVar39 = vpunpckhdq_avx512f(auVar39,auVar38);
          auVar41 = vpaddd_avx512f(auVar39,auVar41);
          auVar39 = vpunpcklqdq_avx512f(auVar40,auVar41);
          auVar40 = vpunpckhqdq_avx512f(auVar40,auVar41);
          auVar40 = vpaddd_avx512f(auVar40,auVar39);
          auVar41 = vpunpckldq_avx512f(auVar37,auVar36);
          auVar39 = vpunpckhdq_avx512f(auVar37,auVar36);
          auVar41 = vpaddd_avx512f(auVar39,auVar41);
          auVar39 = vpunpckldq_avx512f(auVar35,auVar34);
          auVar38 = vpunpckhdq_avx512f(auVar35,auVar34);
          auVar39 = vpaddd_avx512f(auVar38,auVar39);
          auVar38 = vpunpcklqdq_avx512f(auVar41,auVar39);
          auVar41 = vpunpckhqdq_avx512f(auVar41,auVar39);
          auVar41 = vpaddd_avx512f(auVar41,auVar38);
          auVar39 = vmovdqa64_avx512f(auVar40);
          auVar39 = vpermt2q_avx512f(auVar39,auVar19,auVar41);
          auVar40 = vpermt2q_avx512f(auVar40,auVar20,auVar41);
          auVar40 = vpaddd_avx512f(auVar40,auVar39);
          auVar18 = vextracti64x4_avx512f(auVar40,1);
          auVar18 = vpaddd_avx2(auVar40._0_32_,auVar18);
          auVar18 = vcvtdq2ps_avx(auVar18);
          auVar11._4_4_ = in_XMM0_Da * auVar18._4_4_;
          auVar11._0_4_ = in_XMM0_Da * auVar18._0_4_;
          auVar11._8_4_ = in_XMM0_Da * auVar18._8_4_;
          auVar11._12_4_ = in_XMM0_Da * auVar18._12_4_;
          auVar11._16_4_ = in_XMM0_Da * auVar18._16_4_;
          auVar11._20_4_ = in_XMM0_Da * auVar18._20_4_;
          auVar11._24_4_ = in_XMM0_Da * auVar18._24_4_;
          auVar11._28_4_ = auVar18._28_4_;
          *(undefined1 (*) [32])
           (CONCAT44(in_register_0000008c,B_cols) + (ulong)((int)uVar13 * width + (int)uVar17) * 4)
               = auVar11;
          uVar13 = uVar13 + 1;
          uVar15 = (ulong)((int)uVar15 + A_rows);
        } while (uVar13 != ((ulong)B & 0xffffffff));
      }
      uVar17 = uVar17 + 8;
      uVar16 = (ulong)((int)uVar16 + (A_rows >> 6) * 8);
    } while (uVar17 < width);
  }
  return;
}

Assistant:

INTGEMM_AVX512VNNI static void Multiply(const int8_t *A, const int8_t *B, Index A_rows, Index width, Index B_cols, Callback callback) {
    assert(width % sizeof(Register) == 0);
    assert(B_cols % 8 == 0);
    assert(reinterpret_cast<uintptr_t>(A) % sizeof(Register) == 0);
    assert(reinterpret_cast<uintptr_t>(B) % sizeof(Register) == 0);
    auto callback_impl = callbacks::CallbackImpl<CPUType::AVX2, Callback>(callback);
    const Index simd_width = width / sizeof(Register);
    Register zeros = setzero_si<Register>();
    // Go over 8 columns of B at a time.
#pragma omp for
    for (Index B0_colidx = 0; B0_colidx < B_cols; B0_colidx += 8) {
      const Register *B0_col = reinterpret_cast<const Register*>(B) + B0_colidx * simd_width;
      // Process one row of A at a time.  Doesn't seem to be faster to do multiple rows of A at once.
      for (Index A_rowidx = 0; A_rowidx < A_rows; ++A_rowidx) {
        // Iterate over shared (inner) dimension.
        const Register *A_live = reinterpret_cast<const Register *>(A + A_rowidx * width);
        const Register *A_end = A_live + simd_width;
        const Register *B_live = B0_col;
        // TODO: separate first step.
        Register sum0 = zeros, sum1 = zeros, sum2 = zeros, sum3 = zeros, sum4 = zeros, sum5 = zeros, sum6 = zeros, sum7 = zeros;
        for (; A_live != A_end; ++A_live, B_live += 8) {
          Register a = *A_live;
          // Retrieve the conveniently consecutive values of B.
          Register b0 = *B_live;
          Register b1 = *(B_live + 1);
          Register b2 = *(B_live + 2);
          Register b3 = *(B_live + 3);
          Register b4 = *(B_live + 4);
          Register b5 = *(B_live + 5);
          Register b6 = *(B_live + 6);
          Register b7 = *(B_live + 7);
          // Get a mask where a is negative.
          __mmask64 neg_mask = _mm512_test_epi8_mask(a, _mm512_set1_epi8(-128));
          Register a_positive = _mm512_abs_epi8(a);
          // Negate by subtracting from zero with a mask.
          b0 = _mm512_mask_sub_epi8(b0, neg_mask, zeros, b0);
          b1 = _mm512_mask_sub_epi8(b1, neg_mask, zeros, b1);
          b2 = _mm512_mask_sub_epi8(b2, neg_mask, zeros, b2);
          b3 = _mm512_mask_sub_epi8(b3, neg_mask, zeros, b3);
          b4 = _mm512_mask_sub_epi8(b4, neg_mask, zeros, b4);
          b5 = _mm512_mask_sub_epi8(b5, neg_mask, zeros, b5);
          b6 = _mm512_mask_sub_epi8(b6, neg_mask, zeros, b6);
          b7 = _mm512_mask_sub_epi8(b7, neg_mask, zeros, b7);
          VNNI8(sum0, a_positive, b0);
          VNNI8(sum1, a_positive, b1);
          VNNI8(sum2, a_positive, b2);
          VNNI8(sum3, a_positive, b3);
          VNNI8(sum4, a_positive, b4);
          VNNI8(sum5, a_positive, b5);
          VNNI8(sum6, a_positive, b6);
          VNNI8(sum7, a_positive, b7);
        }
        Register pack0123 = Pack0123(sum0, sum1, sum2, sum3);
        Register pack4567 = Pack0123(sum4, sum5, sum6, sum7);
        auto total = PermuteSummer(pack0123, pack4567);
        callback_impl.Run(total, callbacks::OutputBufferInfo(A_rowidx, B0_colidx, A_rows, B_cols));
      }
    }
  }